

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UnaryAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::UnaryAssertionExpr,slang::ast::UnaryAssertionOperator&,slang::ast::AssertionExpr_const&,std::nullopt_t_const&>
          (BumpAllocator *this,UnaryAssertionOperator *args,AssertionExpr *args_1,nullopt_t *args_2)

{
  optional<slang::ast::SequenceRange> range;
  UnaryAssertionExpr *this_00;
  undefined8 in_RDX;
  UnaryAssertionOperator op;
  undefined4 *in_RSI;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar1;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  BumpAllocator *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  
  op = (UnaryAssertionOperator)((ulong)in_RDX >> 0x20);
  this_00 = (UnaryAssertionExpr *)
            allocate(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  uVar1 = *in_RSI;
  std::optional<slang::ast::SequenceRange>::optional
            ((optional<slang::ast::SequenceRange> *)&stack0xffffffffffffffd0);
  range.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::SequenceRange>._8_8_ = in_stack_ffffffffffffffd0;
  range.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._0_8_ =
       in_stack_ffffffffffffffc8;
  ast::UnaryAssertionExpr::UnaryAssertionExpr
            (this_00,op,(AssertionExpr *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),range);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }